

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse-3-implicit-types.cpp
# Opt level: O1

Result<wasm::Ok> *
wasm::WATParser::parseImplicitTypeDefs
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *decls,Lexer *input,
          IndexMap *typeIndices,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
          *implicitTypes)

{
  undefined8 *puVar1;
  __node_base_ptr *this;
  Index *pIVar2;
  ParseDeclsCtx *pPVar3;
  pointer pHVar4;
  Result<wasm::Ok> *pRVar5;
  Index *pIVar6;
  ulong uVar7;
  undefined1 local_158 [8];
  ParseImplicitTypeDefsCtx ctx;
  WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> with;
  Result<wasm::Ok> _val;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  ParseDeclsCtx *local_40;
  Result<wasm::Ok> *local_38;
  
  local_38 = __return_storage_ptr__;
  ParseImplicitTypeDefsCtx::ParseImplicitTypeDefsCtx
            ((ParseImplicitTypeDefsCtx *)local_158,input,types,implicitTypes,typeIndices);
  pIVar6 = (decls->implicitTypeDefs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (decls->implicitTypeDefs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = decls;
  if (pIVar6 != pIVar2) {
    this = &ctx.sigTypes._M_h._M_single_bucket;
    do {
      WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::WithPosition
                ((WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *)this,
                 (ParseImplicitTypeDefsCtx *)local_158,*pIVar6);
      typeuse<wasm::WATParser::ParseImplicitTypeDefsCtx>
                ((Result<wasm::Ok> *)
                 &with.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (ParseImplicitTypeDefsCtx *)local_158,true);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = &local_50;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                   with.annotations.
                   super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (long)&((with.annotations.
                            super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->kind).super_IString
                          .str._M_len +
                   _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_);
        pRVar5 = local_38;
        puVar1 = (undefined8 *)
                 ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if ((undefined1 *)
            _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == &local_50) {
          *puVar1 = CONCAT71(uStack_4f,local_50);
          *(undefined8 *)
           ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_48;
        }
        else {
          *(undefined8 *)
           &(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
          *(ulong *)((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(uStack_4f,local_50);
        }
        *(undefined8 *)
         ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_58;
        local_50 = 0;
        *(__index_type *)
         ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = &local_50;
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   &with.annotations.
                    super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::~WithPosition
                  ((WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *)
                   &ctx.sigTypes._M_h._M_single_bucket);
        goto LAB_00bd3049;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &with.annotations.
                  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx>::~WithPosition
                ((WithPosition<wasm::WATParser::ParseImplicitTypeDefsCtx> *)this);
      pIVar6 = pIVar6 + 1;
    } while (pIVar6 != pIVar2);
  }
  pPVar3 = local_40;
  pHVar4 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar4) {
    uVar7 = 0;
    do {
      ctx.sigTypes._M_h._M_single_bucket = (__node_base_ptr)pHVar4[uVar7].id;
      with.ctx._0_4_ = (int)uVar7;
      std::
      _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&pPVar3->wasm->typeIndices,&ctx.sigTypes._M_h._M_single_bucket);
      uVar7 = (ulong)((int)uVar7 + 1);
      pHVar4 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(types->
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar4 >> 3))
    ;
  }
  *(__index_type *)
   ((long)&(local_38->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  pRVar5 = local_38;
LAB_00bd3049:
  std::
  _Hashtable<wasm::Signature,_std::pair<const_wasm::Signature,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Signature>,_std::hash<wasm::Signature>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Signature,_std::pair<const_wasm::Signature,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Signature>,_std::hash<wasm::Signature>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&ctx.implicitTypes);
  if (ctx.in.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._24_1_ == '\x01') {
    ctx.in.file.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._24_1_ = 0;
    if (ctx.in.annotations.
        super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)((long)&ctx.in.file.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 + 8U)) {
      operator_delete(ctx.in.annotations.
                      super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      ctx.in.file.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length + 1);
    }
  }
  if (ctx.in.pos != 0) {
    operator_delete((void *)ctx.in.pos,
                    (long)ctx.in.annotations.
                          super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                          ._M_impl.super__Vector_impl_data._M_finish - ctx.in.pos);
  }
  return pRVar5;
}

Assistant:

Result<>
parseImplicitTypeDefs(ParseDeclsCtx& decls,
                      Lexer& input,
                      IndexMap& typeIndices,
                      std::vector<HeapType>& types,
                      std::unordered_map<Index, HeapType>& implicitTypes) {
  ParseImplicitTypeDefsCtx ctx(input, types, implicitTypes, typeIndices);
  for (Index pos : decls.implicitTypeDefs) {
    WithPosition with(ctx, pos);
    CHECK_ERR(typeuse(ctx));
  }
  // Record type indices now that all the types have been parsed.
  for (Index i = 0; i < types.size(); ++i) {
    decls.wasm.typeIndices.insert({types[i], i});
  }
  return Ok{};
}